

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<int,int>,int,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (int *adata,AggregateInputData *aggr_input_data,int *bdata,
               ArgMinMaxState<int,_int> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  ulong uVar1;
  idx_t i;
  ulong uVar2;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    local_58.lidx = uVar2;
    if (asel->sel_vector != (sel_t *)0x0) {
      local_58.lidx = (idx_t)asel->sel_vector[uVar2];
    }
    local_58.ridx = uVar2;
    if (bsel->sel_vector != (sel_t *)0x0) {
      local_58.ridx = (idx_t)bsel->sel_vector[uVar2];
    }
    uVar1 = uVar2;
    if (ssel->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)ssel->sel_vector[uVar2];
    }
    ArgMinMaxBase<duckdb::GreaterThan,false>::
    Operation<int,int,duckdb::ArgMinMaxState<int,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
              (states[uVar1],adata + local_58.lidx,bdata + local_58.ridx,&local_58);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}